

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          String *params_6,ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,String *params_12,ArrayPtr<const_char> *params_13,
          StringTree *params_14,StringTree *params_15,StringTree *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          ArrayPtr<const_char> *params_19,String *params_20,ArrayPtr<const_char> *params_21,
          String *params_22,ArrayPtr<const_char> *params_23,ArrayPtr<const_char> *params_24,
          ArrayPtr<const_char> *params_25,StringTree *params_26,ArrayPtr<const_char> *params_27)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  long lVar4;
  Branch *pBVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  String local_180;
  size_t local_168;
  undefined1 local_160 [16];
  size_t local_150;
  char *local_148;
  char *local_140;
  long local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  size_t local_110;
  long local_108;
  size_t local_100;
  undefined1 local_f8 [16];
  size_t local_e8;
  undefined1 local_e0 [16];
  size_t local_d0;
  long local_c8;
  size_t local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  size_t local_a0;
  char *local_98;
  char *local_90;
  StringTree *local_88;
  StringTree *local_80;
  ArrayPtr<const_char> *local_78;
  StringTree *local_70;
  ArrayPtr<const_char> *local_68;
  size_t local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  lVar4 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  lVar7 = 0;
  lVar8 = 0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_88 = this;
  local_168 = this->size_;
  local_38 = (params->text).content.ptr;
  local_40 = params_1->size_;
  local_160._8_8_ = local_40;
  local_160._0_8_ = local_38;
  local_48 = params_2->size_;
  local_150 = local_48;
  local_148 = params_3->ptr;
  local_50 = (params_4->text).content.ptr;
  local_140 = local_50;
  local_138 = params_5->size_ - 1;
  if (params_5->size_ == 0) {
    local_138 = lVar4;
  }
  local_58 = (params_6->content).size_;
  local_60 = params_7->size_;
  local_130._8_8_ = local_60;
  local_130._0_8_ = local_58;
  local_120._8_8_ = params_9->size_;
  local_120._0_8_ = params_8->size_;
  local_110 = params_10->size_;
  local_108 = params_11->size_ - 1;
  if (params_11->size_ == 0) {
    local_108 = lVar4;
  }
  local_100 = (params_12->content).size_;
  local_f8._8_8_ = params_14->size_;
  local_f8._0_8_ = params_13->ptr;
  local_e8 = params_15->size_;
  local_e0._0_8_ = (params_16->text).content.ptr;
  local_e0._8_8_ = params_17->size_;
  local_d0 = params_18->size_;
  local_c8 = params_19->size_ - 1;
  if (params_19->size_ == 0) {
    local_c8 = lVar4;
  }
  local_c0 = (params_20->content).size_;
  local_b8 = params_21->size_ - 1;
  if (params_21->size_ == 0) {
    local_b8 = lVar4;
  }
  local_b0._0_8_ = (params_22->content).size_;
  local_b0._8_8_ = params_23->size_;
  local_a0 = params_24->size_;
  local_98 = params_25->ptr;
  local_90 = (params_26->text).content.ptr;
  do {
    lVar7 = lVar7 + *(long *)(local_160 + lVar4 * 8 + -8);
    lVar8 = lVar8 + *(long *)(local_160 + lVar4 * 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x1c);
  lVar4 = 0;
  local_168 = 0;
  local_148 = (char *)0x0;
  local_138 = 0;
  local_108 = 0;
  lVar9 = 0;
  lVar11 = 0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = 0;
  local_c8 = 0;
  local_b8 = 0;
  local_98 = (char *)0x0;
  __return_storage_ptr__->size_ = lVar8 + lVar7;
  do {
    lVar9 = lVar9 + *(long *)(local_160 + lVar4 * 8 + -8);
    lVar11 = lVar11 + *(long *)(local_160 + lVar4 * 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x1c);
  local_80 = params;
  local_78 = params_1;
  local_70 = (StringTree *)params_3;
  local_68 = params_2;
  heapString(&local_180,lVar11 + lVar9);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar10 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar6,1,sVar10,sVar10,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_180.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_180.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_180.content.disposer;
  local_168 = 1;
  lVar7 = 0;
  lVar8 = 0;
  local_160 = (undefined1  [16])0x0;
  lVar4 = 0;
  local_150 = 0;
  local_148 = (char *)0x1;
  local_140 = (char *)0x0;
  local_138 = 1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (undefined1  [16])0x0;
  local_110 = 0;
  local_108 = 1;
  local_100 = 0;
  local_f8._8_8_ = 1;
  local_f8._0_8_ = 1;
  local_e8 = 1;
  local_e0 = (undefined1  [16])0x0;
  local_d0 = 0;
  local_c8 = 1;
  local_c0 = 0;
  local_b8 = 1;
  local_a0 = 0;
  local_b0 = (undefined1  [16])0x0;
  local_98 = (char *)0x1;
  local_90 = (char *)0x0;
  do {
    lVar7 = lVar7 + *(long *)(local_160 + lVar4 * 8 + -8);
    lVar8 = lVar8 + *(long *)(local_160 + lVar4 * 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x1c);
  sVar10 = lVar8 + lVar7;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar10,sVar10,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_180.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_180.content.ptr = (char *)pBVar5;
  local_180.content.size_ = sVar10;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = sVar10;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,local_88,(ArrayPtr<const_char> *)local_80,local_78,
             local_68,local_70,(ArrayPtr<const_char> *)params_4,(String *)params_5,
             (ArrayPtr<const_char> *)params_6,params_7,params_8,params_9,params_10,
             (String *)params_11,(ArrayPtr<const_char> *)params_12,(StringTree *)params_13,params_14
             ,params_15,(ArrayPtr<const_char> *)params_16,params_17,params_18,(String *)params_19,
             (ArrayPtr<const_char> *)params_20,(String *)params_21,(ArrayPtr<const_char> *)params_22
             ,params_23,params_24,(StringTree *)params_25,(ArrayPtr<const_char> *)params_26);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}